

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

void __thiscall flow::lang::Lexer::processCommand(Lexer *this,string *line)

{
  Report *this_00;
  int iVar1;
  long lVar2;
  long lVar3;
  allocator<char> local_41;
  string pattern;
  
  iVar1 = strncmp((line->_M_dataplus)._M_p,"include",7);
  if (iVar1 == 0) {
    lVar2 = std::__cxx11::string::find((char)line,0x22);
    lVar3 = std::__cxx11::string::rfind((char)line,0x22);
    if (lVar2 == -1 || lVar3 == -1) {
      this_00 = this->report_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pattern,"Malformed #include line",&local_41);
      diagnostics::Report::tokenError<>(this_00,&this->lastLocation_,&pattern);
    }
    else {
      std::__cxx11::string::substr((ulong)&pattern,(ulong)line);
      enterScope(this,&pattern);
    }
    std::__cxx11::string::~string((string *)&pattern);
  }
  return;
}

Assistant:

void Lexer::processCommand(const std::string& line) {
  // `#include "glob"`

  if (strncmp(line.c_str(), "include", 7) != 0) return;

  // TODO this is *very* basic sub-tokenization, but it does well until properly
  // implemented.

  size_t beg = line.find('"');
  size_t end = line.rfind('"');
  if (beg == std::string::npos || end == std::string::npos) {
    report_.tokenError(lastLocation(), "Malformed #include line");
    return;
  }

  std::string pattern = line.substr(beg + 1, end - beg - 1);

#if defined(HAVE_GLOB_H)
  glob_t gl;

  int globOptions = 0;
#if defined(GLOB_TILDE)
  globOptions |= GLOB_TILDE;
#endif

  int rv = glob(pattern.c_str(), globOptions, nullptr, &gl);
  if (rv != 0) {
    static std::unordered_map<int, const char*> globErrs = {
        {GLOB_NOSPACE, "No space"},
        {GLOB_ABORTED, "Aborted"},
        {GLOB_NOMATCH, "No Match"}, };
    report_.tokenError(lastLocation(), "glob() error: {}", globErrs[rv]);
    return;
  }

  // put globbed files on stack in reverse order, to be lexed in the right order
  for (size_t i = 0; i < gl.gl_pathc; ++i) {
    const char* filename = gl.gl_pathv[gl.gl_pathc - i - 1];
    enterScope(filename);
  }

  globfree(&gl);
#else
  enterScope(pattern);
#endif
}